

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseSystemLiteral(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputState xVar2;
  xmlParserInputPtr pxVar3;
  xmlParserCtxtPtr pxVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlParserErrors error;
  int iVar10;
  uint uVar11;
  int l;
  xmlParserCtxtPtr local_48;
  int local_3c;
  uint local_38;
  int local_34;
  
  local_34 = 10000000;
  if ((ctxt->options & 0x80000) == 0) {
    local_34 = 50000;
  }
  xVar2 = ctxt->instate;
  if (ctxt->progressive == 0) {
    pxVar3 = ctxt->input;
    if ((500 < (long)pxVar3->cur - (long)pxVar3->base) &&
       ((long)pxVar3->end - (long)pxVar3->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  bVar1 = *ctxt->input->cur;
  uVar5 = (uint)bVar1;
  if (bVar1 != 0x22) {
    if (bVar1 != 0x27) {
      pxVar8 = (xmlChar *)0x0;
      error = XML_ERR_LITERAL_NOT_STARTED;
LAB_00157af8:
      xmlFatalErr(ctxt,error,(char *)0x0);
      return pxVar8;
    }
    uVar5 = 0x27;
  }
  xmlNextChar(ctxt);
  pxVar8 = (xmlChar *)(*xmlMallocAtomic)(100);
  if (pxVar8 == (xmlChar *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
  }
  else {
    ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
    local_48 = ctxt;
    local_38 = uVar5;
    uVar5 = xmlCurrentChar(ctxt,&l);
    iVar7 = 0;
    iVar10 = 100;
    local_3c = 0;
    do {
      if ((int)uVar5 < 0x100) {
        if ((((int)uVar5 < 0x20) &&
            ((uVar11 = uVar5, 0xd < uVar5 || ((0x2600U >> (uVar5 & 0x1f) & 1) == 0)))) ||
           (uVar11 = local_38, uVar5 == local_38)) {
          pxVar8[iVar7] = '\0';
          local_48->instate = xVar2;
          if ((0x1f < (int)uVar11) || ((uVar11 < 0xe && ((0x2600U >> (uVar11 & 0x1f) & 1) != 0))))
          goto LAB_00157bc8;
          goto LAB_00157b8d;
        }
      }
      else if ((uVar5 == local_38) ||
              ((uVar5 - 0xfffe < 0xffffe002 && uVar5 - 0x110000 < 0xfff00000) && 0xd7ff < uVar5)) {
        pxVar8[iVar7] = '\0';
        local_48->instate = xVar2;
        if (uVar5 - 0x10000 < 0x100000 || (uVar5 - 0xe000 < 0x1ffe || uVar5 < 0xd800)) {
LAB_00157bc8:
          xmlNextChar(local_48);
          return pxVar8;
        }
LAB_00157b8d:
        error = XML_ERR_LITERAL_NOT_FINISHED;
        ctxt = local_48;
        goto LAB_00157af8;
      }
      pxVar9 = pxVar8;
      if (iVar10 <= iVar7 + 5) {
        iVar10 = iVar10 * 2;
        pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar8,(long)iVar10);
        if (pxVar9 == (xmlChar *)0x0) {
          (*xmlFree)(pxVar8);
          pxVar4 = local_48;
          xmlErrMemory(local_48,(char *)0x0);
          pxVar4->instate = xVar2;
          return (xmlChar *)0x0;
        }
      }
      pxVar8 = pxVar9;
      pxVar4 = local_48;
      if (local_3c < 0x32) {
        local_3c = local_3c + 1;
      }
      else {
        if (local_48->progressive == 0) {
          pxVar3 = local_48->input;
          if (((((long)pxVar3->cur - (long)pxVar3->base < 0x1f5) ||
               (499 < (long)pxVar3->end - (long)pxVar3->cur)) ||
              (xmlSHRINK(local_48), pxVar4->progressive == 0)) &&
             ((long)pxVar4->input->end - (long)pxVar4->input->cur < 0xfa)) {
            xmlGROW(pxVar4);
          }
        }
        local_3c = 0;
        if (pxVar4->instate == XML_PARSER_EOF) {
          (*xmlFree)(pxVar8);
          return (xmlChar *)0x0;
        }
      }
      if (l == 1) {
        pxVar8[iVar7] = (xmlChar)uVar5;
        iVar7 = iVar7 + 1;
      }
      else {
        iVar6 = xmlCopyCharMultiByte(pxVar8 + iVar7,uVar5);
        iVar7 = iVar6 + iVar7;
      }
      pxVar3 = pxVar4->input;
      if (*pxVar3->cur == '\n') {
        pxVar3->line = pxVar3->line + 1;
        pxVar3->col = 1;
      }
      else {
        pxVar3->col = pxVar3->col + 1;
      }
      pxVar3->cur = pxVar3->cur + l;
      uVar5 = xmlCurrentChar(pxVar4,&l);
      if (uVar5 == 0) {
        if ((pxVar4->progressive == 0) &&
           ((0xf9 < (long)pxVar4->input->end - (long)pxVar4->input->cur ||
            (xmlGROW(pxVar4), pxVar4->progressive == 0)))) {
          pxVar3 = pxVar4->input;
          if ((500 < (long)pxVar3->cur - (long)pxVar3->base) &&
             ((long)pxVar3->end - (long)pxVar3->cur < 500)) {
            xmlSHRINK(pxVar4);
          }
        }
        uVar5 = xmlCurrentChar(pxVar4,&l);
      }
      pxVar4 = local_48;
    } while (iVar7 <= local_34);
    xmlFatalErr(local_48,XML_ERR_NAME_TOO_LONG,"SystemLiteral");
    (*xmlFree)(pxVar8);
    pxVar4->instate = xVar2;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseSystemLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar stop;
    int state = ctxt->instate;
    int count = 0;

    SHRINK;
    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }

    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
        xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
    cur = CUR_CHAR(l);
    while ((IS_CHAR(cur)) && (cur != stop)) { /* checked */
	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = (xmlParserInputState) state;
		return(NULL);
	    }
	    buf = tmp;
	}
	count++;
	if (count > 50) {
	    SHRINK;
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
	        xmlFree(buf);
		return(NULL);
            }
	}
	COPY_BUF(l,buf,len,cur);
	NEXTL(l);
	cur = CUR_CHAR(l);
	if (cur == 0) {
	    GROW;
	    SHRINK;
	    cur = CUR_CHAR(l);
	}
        if (len > maxLength) {
            xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "SystemLiteral");
            xmlFree(buf);
            ctxt->instate = (xmlParserInputState) state;
            return(NULL);
        }
    }
    buf[len] = 0;
    ctxt->instate = (xmlParserInputState) state;
    if (!IS_CHAR(cur)) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    return(buf);
}